

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_prn.cc
# Opt level: O0

int unknown_ext_print(BIO *out,X509_EXTENSION *ext,unsigned_long flag,int indent,int supported)

{
  int iVar1;
  ulong uVar2;
  ASN1_OCTET_STRING *str;
  uchar *data_00;
  ASN1_STRING *data;
  int supported_local;
  int indent_local;
  unsigned_long flag_local;
  X509_EXTENSION *ext_local;
  BIO *out_local;
  
  uVar2 = flag & 0xf0000;
  if (uVar2 == 0) {
    out_local._4_4_ = 0;
  }
  else if (uVar2 == 0x10000) {
    if (supported == 0) {
      BIO_printf((BIO *)out,"%*s<Not Supported>",(ulong)(uint)indent,"");
    }
    else {
      BIO_printf((BIO *)out,"%*s<Parse Error>",(ulong)(uint)indent,"");
    }
    out_local._4_4_ = 1;
  }
  else if ((uVar2 == 0x20000) || (uVar2 == 0x30000)) {
    str = X509_EXTENSION_get_data((X509_EXTENSION *)ext);
    data_00 = ASN1_STRING_get0_data((ASN1_STRING *)str);
    iVar1 = ASN1_STRING_length(str);
    out_local._4_4_ = BIO_hexdump(out,data_00,(long)iVar1,indent);
  }
  else {
    out_local._4_4_ = 1;
  }
  return out_local._4_4_;
}

Assistant:

static int unknown_ext_print(BIO *out, const X509_EXTENSION *ext,
                             unsigned long flag, int indent, int supported) {
  switch (flag & X509V3_EXT_UNKNOWN_MASK) {
    case X509V3_EXT_DEFAULT:
      return 0;

    case X509V3_EXT_ERROR_UNKNOWN:
      if (supported) {
        BIO_printf(out, "%*s<Parse Error>", indent, "");
      } else {
        BIO_printf(out, "%*s<Not Supported>", indent, "");
      }
      return 1;

    case X509V3_EXT_PARSE_UNKNOWN:
    case X509V3_EXT_DUMP_UNKNOWN: {
      const ASN1_STRING *data = X509_EXTENSION_get_data(ext);
      return BIO_hexdump(out, ASN1_STRING_get0_data(data),
                         ASN1_STRING_length(data), indent);
    }

    default:
      return 1;
  }
}